

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  SessionHandle *data;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t __n;
  ulong uVar7;
  char *pcVar8;
  short *__s1;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  pcVar8 = (conn->proto).imapc.resptag;
  __n = strlen(pcVar8);
  uVar7 = __n + 1;
  if (((uVar7 <= len) && (iVar4 = bcmp(pcVar8,line,__n), iVar4 == 0)) && (line[__n] == ' ')) {
    pcVar8 = "Bad tagged response";
    if (len - uVar7 < 2) {
LAB_0050230e:
      Curl_failf(data,pcVar8);
      iVar4 = -1;
    }
    else {
      __s1 = (short *)(line + uVar7);
      if (*__s1 == 0x4b4f) {
        iVar4 = 0x4f;
      }
      else if (*__s1 == 0x4f4e) {
        iVar4 = 0x4e;
      }
      else {
        if ((len - uVar7 == 2) || (iVar4 = bcmp(__s1,"BAD",3), iVar4 != 0)) goto LAB_0050230e;
        iVar4 = 0x42;
      }
    }
    goto switchD_00502354_caseD_15;
  }
  if (len < 2) goto LAB_0050247e;
  if (*(short *)line != 0x202a) {
    if (((len != 3) || (*line != '+')) && (*(short *)line != 0x202b)) goto LAB_0050247e;
    uVar5 = (conn->proto).imapc.state - IMAP_AUTHENTICATE_PLAIN;
    pcVar8 = "Unexpected continuation response";
    if ((0x13 < uVar5) || ((0x828ffU >> (uVar5 & 0x1f) & 1) == 0)) goto LAB_0050230e;
    iVar4 = 0x2b;
    goto switchD_00502354_caseD_15;
  }
  iVar1 = (conn->proto).imapc.state;
  iVar4 = 0x2a;
  _Var3 = false;
  switch(iVar1) {
  case IMAP_LIST:
    pcVar8 = *(char **)((long)pvVar2 + 0x38);
    if (pcVar8 == (char *)0x0) {
      _Var3 = imap_matchresp(line,len,"LIST");
      if (!_Var3) goto LAB_0050247e;
      pcVar8 = *(char **)((long)pvVar2 + 0x38);
      if (pcVar8 == (char *)0x0) goto switchD_00502354_caseD_15;
    }
    _Var3 = imap_matchresp(line,len,pcVar8);
    if (!_Var3) {
      pcVar8 = *(char **)((long)pvVar2 + 0x38);
      iVar6 = strcmp(pcVar8,"STORE");
      if (iVar6 == 0) {
        _Var3 = imap_matchresp(line,len,"FETCH");
        if (_Var3) goto switchD_00502354_caseD_15;
        pcVar8 = *(char **)((long)pvVar2 + 0x38);
      }
      iVar6 = strcmp(pcVar8,"SELECT");
      if (((((iVar6 != 0) && (iVar6 = strcmp(pcVar8,"EXAMINE"), iVar6 != 0)) &&
           (iVar6 = strcmp(pcVar8,"SEARCH"), iVar6 != 0)) &&
          ((iVar6 = strcmp(pcVar8,"EXPUNGE"), iVar6 != 0 &&
           (iVar6 = strcmp(pcVar8,"LSUB"), iVar6 != 0)))) &&
         ((iVar6 = strcmp(pcVar8,"UID"), iVar6 != 0 && (iVar6 = strcmp(pcVar8,"NOOP"), iVar6 != 0)))
         ) goto LAB_0050247e;
    }
  case IMAP_SELECT:
    goto switchD_00502354_caseD_15;
  case IMAP_FETCH:
    pcVar8 = "FETCH";
    break;
  case IMAP_FETCH_FINAL:
  case IMAP_APPEND:
  case IMAP_APPEND_FINAL:
    goto switchD_00502354_caseD_17;
  case IMAP_SEARCH:
    pcVar8 = "SEARCH";
    break;
  default:
    if (iVar1 != IMAP_CAPABILITY) {
      return false;
    }
    pcVar8 = "CAPABILITY";
  }
  _Var3 = imap_matchresp(line,len,pcVar8);
  if (_Var3) {
switchD_00502354_caseD_15:
    *resp = iVar4;
    _Var3 = true;
  }
  else {
LAB_0050247e:
    _Var3 = false;
  }
switchD_00502354_caseD_17:
  return _Var3;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = 'O';
    else if(len >= 2 && !memcmp(line, "NO", 2))
      *resp = 'N';
    else if(len >= 3 && !memcmp(line, "BAD", 3))
      *resp = 'B';
    else {
      failf(conn->data, "Bad tagged response");
      *resp = -1;
    }

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (strcmp(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           strcmp(imap->custom, "SELECT") &&
           strcmp(imap->custom, "EXAMINE") &&
           strcmp(imap->custom, "SEARCH") &&
           strcmp(imap->custom, "EXPUNGE") &&
           strcmp(imap->custom, "LSUB") &&
           strcmp(imap->custom, "UID") &&
           strcmp(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if((len == 3 && !memcmp("+", line, 1)) ||
     (len >= 2 && !memcmp("+ ", line, 2))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE_PLAIN:
      case IMAP_AUTHENTICATE_LOGIN:
      case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      case IMAP_AUTHENTICATE_CRAMMD5:
      case IMAP_AUTHENTICATE_DIGESTMD5:
      case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      case IMAP_AUTHENTICATE_NTLM:
      case IMAP_AUTHENTICATE_NTLM_TYPE2MSG:
      case IMAP_AUTHENTICATE_XOAUTH2:
      case IMAP_AUTHENTICATE_FINAL:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}